

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api.cpp
# Opt level: O0

RK_S32 vpu_api_sendframe(VpuCodecContext *ctx,EncInputStream_t *aEncInStrm)

{
  VpuApiLegacy *api;
  EncInputStream_t *aEncInStrm_local;
  VpuCodecContext *ctx_local;
  
  if (ctx == (VpuCodecContext *)0x0) {
    _mpp_log_l(4,"vpu_api","vpu_api_decode fail, input invalid",0);
    ctx_local._4_4_ = -1;
  }
  else if ((VpuApiLegacy *)ctx->vpuApiObj == (VpuApiLegacy *)0x0) {
    _mpp_log_l(4,"vpu_api","vpu_api_sendframe fail, vpu api invalid",0);
    ctx_local._4_4_ = -1;
  }
  else {
    ctx_local._4_4_ = VpuApiLegacy::encoder_sendframe((VpuApiLegacy *)ctx->vpuApiObj,ctx,aEncInStrm)
    ;
  }
  return ctx_local._4_4_;
}

Assistant:

static RK_S32
vpu_api_sendframe(VpuCodecContext *ctx, EncInputStream_t *aEncInStrm)
{
    if (ctx == NULL) {
        mpp_log("vpu_api_decode fail, input invalid");
        return VPU_API_ERR_UNKNOW;
    }

    VpuApiLegacy* api = (VpuApiLegacy*)(ctx->vpuApiObj);
    if (api == NULL) {
        mpp_log("vpu_api_sendframe fail, vpu api invalid");
        return VPU_API_ERR_UNKNOW;
    }

    return api->encoder_sendframe(ctx, aEncInStrm);
}